

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigIntInherited.cpp
# Opt level: O2

ostream * operator<<(ostream *os,BigIntInherited *obj)

{
  ostream *poVar1;
  BigInt BStack_38;
  
  poVar1 = std::operator<<(os,"\x1b[0;");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,obj->_color);
  std::operator<<(poVar1,"m");
  BigInt::BigInt(&BStack_38,&obj->super_BigInt);
  operator<<(os,&BStack_38);
  BigInt::~BigInt(&BStack_38);
  poVar1 = std::operator<<(os,"\x1b[0;");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x1e);
  std::operator<<(poVar1,"m");
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const BigIntInherited &obj)
{
    os << "\033[0;" << obj._color << "m";
    os << (BigInt) obj;
    os << "\033[0;" << 30 << "m";
    return os;
}